

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O3

int Lodtalk::IdentityDictionary::stAssociationAtOrNil(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop OVar2;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    OVar2.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    OVar2.field_0.uintValue._4_4_ = extraout_var_01;
    OVar2 = HashedCollection::
            internalKeyValueAtOrNil<Lodtalk::Oop(Lodtalk::Oop),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                      ((HashedCollection *)CONCAT44(extraout_var_00,iVar1),OVar2,getLookupKeyKey,
                       identityHashOf,identityOopEquals);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar2.field_0);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int IdentityDictionary::stAssociationAtOrNil(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop key = interpreter->getTemporary(0);
    auto self = reinterpret_cast<IdentityDictionary*> (selfOop.pointer);
    return interpreter->returnOop(self->getAssociationOrNil(key));
}